

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
          (PortalImageInfiniteLight *this,Transform *renderFromLight,Image *equiAreaImage,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,Allocator alloc)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  bool bVar10;
  size_type sVar11;
  reference pvVar12;
  Point3<float> *pPVar13;
  Allocator AVar14;
  Image *pIVar15;
  Tuple2<pbrt::Point2,_int> dxdA;
  Point2i PVar16;
  undefined8 in_RCX;
  Image *in_RDX;
  long start;
  long in_RDI;
  Tuple3<pbrt::Vector3,_float> *pTVar17;
  string *this_00;
  string *in_R8;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_R9;
  undefined4 in_XMM0_Da;
  float fVar18;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar19;
  undefined8 uVar20;
  Tuple2<pbrt::Point2,_int> resolution;
  ColorEncodingHandle *encoding;
  Vector3<float> VVar21;
  Tuple3<pbrt::Vector3,_float> TVar22;
  Image *in_stack_00000008;
  Array2D<float> d;
  anon_class_8_1_8991fb9c duvdw;
  Vector3f p03;
  Vector3f p32;
  Vector3f p12;
  Vector3f p01;
  int i;
  size_t vb;
  int va;
  ImageChannelDesc channelDesc;
  Image *in_stack_fffffffffffff758;
  Image *in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff768;
  LightType in_stack_fffffffffffff76c;
  LightBase *in_stack_fffffffffffff770;
  WindowedPiecewiseConstant2D *in_stack_fffffffffffff778;
  Allocator in_stack_fffffffffffff780;
  WindowedPiecewiseConstant2D *in_stack_fffffffffffff788;
  Allocator in_stack_fffffffffffff790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7a0;
  char (*in_stack_fffffffffffff7a8) [19];
  char (*in_stack_fffffffffffff7b0) [2];
  char *in_stack_fffffffffffff7b8;
  undefined8 in_stack_fffffffffffff7c0;
  LogLevel level;
  char *in_stack_fffffffffffff7c8;
  string *psVar23;
  undefined8 in_stack_fffffffffffff7d0;
  LogLevel level_00;
  Image *in_stack_fffffffffffff7d8;
  Allocator in_stack_fffffffffffff7e0;
  int *in_stack_fffffffffffff7e8;
  char (*in_stack_fffffffffffff7f0) [19];
  unsigned_long *in_stack_fffffffffffff7f8;
  Bounds2f *domain;
  undefined4 in_stack_fffffffffffff810;
  float in_stack_fffffffffffff814;
  float in_stack_fffffffffffff818;
  float in_stack_fffffffffffff81c;
  undefined4 in_stack_fffffffffffff838;
  undefined4 in_stack_fffffffffffff83c;
  undefined4 in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff844;
  size_t in_stack_fffffffffffff848;
  PixelFormat in_stack_fffffffffffff87c;
  undefined4 in_stack_fffffffffffff890;
  string *local_5e8;
  int iStack_454;
  allocator<char> local_43b;
  allocator<char> local_43a;
  undefined1 local_439 [41];
  undefined1 local_410 [32];
  undefined1 local_3f0 [32];
  undefined1 *local_3d0;
  undefined8 local_3c8;
  Tuple2<pbrt::Point2,_int> local_3b0;
  undefined8 local_28c;
  undefined8 uStack_284;
  undefined8 uStack_27c;
  undefined8 uStack_274;
  undefined4 local_26c;
  Tuple3<pbrt::Vector3,_float> local_268;
  undefined8 local_258;
  float local_250;
  undefined8 local_248;
  float local_240;
  Tuple3<pbrt::Vector3,_float> local_238;
  Tuple3<pbrt::Vector3,_float> local_228;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  Tuple3<pbrt::Vector3,_float> local_1f8;
  Tuple3<pbrt::Vector3,_float> local_1e8;
  undefined8 local_1d8;
  float local_1d0;
  undefined8 local_1c8;
  float local_1c0;
  Tuple3<pbrt::Vector3,_float> local_1b8;
  Tuple3<pbrt::Vector3,_float> local_1a8;
  undefined8 local_198;
  float local_190;
  undefined8 local_188;
  float local_180;
  Tuple3<pbrt::Vector3,_float> local_178;
  int local_16c;
  size_type local_168;
  Tuple2<pbrt::Point2,_int> local_160;
  Tuple2<pbrt::Point2,_int> local_158;
  Tuple2<pbrt::Point2,_int> local_150;
  Tuple2<pbrt::Point2,_int> local_148;
  size_t local_140;
  int local_138;
  undefined1 local_134;
  allocator<char> local_133;
  allocator<char> local_132;
  allocator<char> local_131;
  string *local_130;
  string local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  string *local_c8;
  undefined8 local_c0;
  Image *local_78;
  Image *local_60;
  undefined1 local_58 [16];
  string *local_38;
  undefined4 local_2c;
  undefined8 local_28;
  Image *local_8;
  
  local_8 = in_stack_00000008;
  local_58 = (undefined1  [16])0x0;
  local_38 = in_R8;
  local_2c = in_XMM0_Da;
  local_28 = in_RCX;
  MediumInterface::MediumInterface((MediumInterface *)in_stack_fffffffffffff760);
  LightBase::LightBase
            (in_stack_fffffffffffff770,in_stack_fffffffffffff76c,
             (Transform *)in_stack_fffffffffffff760,(MediumInterface *)in_stack_fffffffffffff758);
  std::__cxx11::string::string((string *)(in_RDI + 0x98),local_38);
  local_60 = local_8;
  Image::Image(in_stack_fffffffffffff7d8,in_stack_fffffffffffff7e0);
  *(undefined8 *)(in_RDI + 0x1d0) = local_28;
  *(undefined4 *)(in_RDI + 0x1d8) = local_2c;
  Frame::Frame((Frame *)in_stack_fffffffffffff760);
  pstd::array<pbrt::Point3<float>,_4>::array
            ((array<pbrt::Point3<float>,_4> *)in_stack_fffffffffffff770);
  local_78 = local_8;
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
            (in_stack_fffffffffffff778,in_stack_fffffffffffff780);
  Point3<float>::Point3((Point3<float> *)0x619f82);
  local_134 = 1;
  local_130 = local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798,
             (allocator<char> *)in_stack_fffffffffffff790.memoryResource);
  local_130 = (string *)local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798,
             (allocator<char> *)in_stack_fffffffffffff790.memoryResource);
  local_130 = (string *)local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798,
             (allocator<char> *)in_stack_fffffffffffff790.memoryResource);
  local_134 = 0;
  local_c8 = local_128;
  local_c0 = 3;
  v._M_array._4_4_ = in_stack_fffffffffffff76c;
  v._M_array._0_4_ = in_stack_fffffffffffff768;
  v._M_len = (size_type)in_stack_fffffffffffff770;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff760,v);
  requestedChannels.ptr._4_4_ = in_stack_fffffffffffff844;
  requestedChannels.ptr._0_4_ = in_stack_fffffffffffff840;
  requestedChannels.n = in_stack_fffffffffffff848;
  Image::GetChannelDesc
            ((Image *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
             requestedChannels);
  local_5e8 = (string *)&local_c8;
  do {
    local_5e8 = local_5e8 + -0x20;
    std::__cxx11::string::~string(local_5e8);
    level = (LogLevel)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
    level_00 = (LogLevel)((ulong)in_stack_fffffffffffff7d0 >> 0x20);
  } while (local_5e8 != local_128);
  std::allocator<char>::~allocator(&local_133);
  std::allocator<char>::~allocator(&local_132);
  std::allocator<char>::~allocator(&local_131);
  uVar19 = extraout_XMM0_Qb;
  bVar10 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x61a15b);
  if (!bVar10) {
    ErrorExit<std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffff790.memoryResource,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff788);
  }
  local_138 = 3;
  local_140 = ImageChannelDesc::size((ImageChannelDesc *)0x61a32d);
  if ((long)local_138 != local_140) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (level_00,in_stack_fffffffffffff7c8,level,in_stack_fffffffffffff7b8,
               in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
               (char (*) [2])in_stack_fffffffffffff7e0.memoryResource,in_stack_fffffffffffff7e8,
               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7f8);
  }
  bVar10 = ImageChannelDesc::IsIdentity
                     ((ImageChannelDesc *)
                      CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
  if (!bVar10) {
    LogFatal<char_const(&)[25]>
              (level,in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
               *in_stack_fffffffffffff7a8,(char (*) [25])in_stack_fffffffffffff7a0);
  }
  local_148 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(in_RDX);
  iVar9 = local_148.x;
  local_150 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(in_RDX);
  if (iVar9 != local_150.y) {
    local_158 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(in_RDX);
    local_160 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(in_RDX);
    ErrorExit<std::__cxx11::string_const&,int,int>
              ((char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
               (int *)in_stack_fffffffffffff790.memoryResource,(int *)in_stack_fffffffffffff788);
  }
  sVar11 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(in_R9);
  if (sVar11 != 4) {
    local_168 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(in_R9)
    ;
    ErrorExit<unsigned_long>
              ((char *)in_stack_fffffffffffff790.memoryResource,
               (unsigned_long *)in_stack_fffffffffffff788);
  }
  for (local_16c = 0; local_16c < 4; local_16c = local_16c + 1) {
    pvVar12 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                        (in_R9,(long)local_16c);
    pPVar13 = pstd::array<pbrt::Point3<float>,_4>::operator[]
                        ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x200),(long)local_16c);
    fVar18 = (pvVar12->super_Tuple3<pbrt::Point3,_float>).y;
    (pPVar13->super_Tuple3<pbrt::Point3,_float>).x = (pvVar12->super_Tuple3<pbrt::Point3,_float>).x;
    (pPVar13->super_Tuple3<pbrt::Point3,_float>).y = fVar18;
    (pPVar13->super_Tuple3<pbrt::Point3,_float>).z = (pvVar12->super_Tuple3<pbrt::Point3,_float>).z;
  }
  pstd::array<pbrt::Point3<float>,_4>::operator[]
            ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x200),1);
  pstd::array<pbrt::Point3<float>,_4>::operator[]
            ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x200),0);
  VVar21 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffff770,
                      (Point3<float> *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768)
                     );
  local_190 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar20 = 0;
  auVar8._8_8_ = uVar19;
  auVar8._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_198 = vmovlpd_avx(auVar8);
  local_188 = local_198;
  local_180 = local_190;
  VVar21 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffff780.memoryResource);
  local_1a8.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar19 = 0;
  auVar7._8_8_ = uVar20;
  auVar7._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_1a8._0_8_ = vmovlpd_avx(auVar7);
  local_178._0_8_ = local_1a8._0_8_;
  local_178.z = local_1a8.z;
  pstd::array<pbrt::Point3<float>,_4>::operator[]
            ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x200),2);
  pstd::array<pbrt::Point3<float>,_4>::operator[]
            ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x200),1);
  VVar21 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffff770,
                      (Point3<float> *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768)
                     );
  local_1d0 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar20 = 0;
  auVar6._8_8_ = uVar19;
  auVar6._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_1d8 = vmovlpd_avx(auVar6);
  local_1c8 = local_1d8;
  local_1c0 = local_1d0;
  VVar21 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffff780.memoryResource);
  local_1e8.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar19 = 0;
  auVar5._8_8_ = uVar20;
  auVar5._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_1e8._0_8_ = vmovlpd_avx(auVar5);
  local_1b8._0_8_ = local_1e8._0_8_;
  local_1b8.z = local_1e8.z;
  pstd::array<pbrt::Point3<float>,_4>::operator[]
            ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x200),2);
  pstd::array<pbrt::Point3<float>,_4>::operator[]
            ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x200),3);
  VVar21 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffff770,
                      (Point3<float> *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768)
                     );
  local_210 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  resolution.x = 0;
  resolution.y = 0;
  auVar4._8_8_ = uVar19;
  auVar4._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_218 = vmovlpd_avx(auVar4);
  local_208 = local_218;
  local_200 = local_210;
  TVar22 = (Tuple3<pbrt::Vector3,_float>)
           Normalize<float>((Vector3<float> *)in_stack_fffffffffffff780.memoryResource);
  local_228.z = TVar22.z;
  encoding = (ColorEncodingHandle *)0x0;
  auVar3._8_4_ = resolution.x;
  auVar3._12_4_ = resolution.y;
  auVar3._0_8_ = TVar22._0_8_;
  local_228._0_8_ = vmovlpd_avx(auVar3);
  local_1f8._0_8_ = local_228._0_8_;
  local_1f8.z = local_228.z;
  AVar14.memoryResource =
       (memory_resource *)
       pstd::array<pbrt::Point3<float>,_4>::operator[]
                 ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x200),3);
  pIVar15 = (Image *)pstd::array<pbrt::Point3<float>,_4>::operator[]
                               ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x200),0);
  VVar21 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffff770,
                      (Point3<float> *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768)
                     );
  local_250 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar19 = 0;
  auVar2._8_8_ = encoding;
  auVar2._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_258 = vmovlpd_avx(auVar2);
  local_248 = local_258;
  local_240 = local_250;
  VVar21 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffff780.memoryResource);
  local_268.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar1._8_8_ = uVar19;
  auVar1._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_268._0_8_ = vmovlpd_avx(auVar1);
  pTVar17 = &local_178;
  local_238._0_8_ = local_268._0_8_;
  local_238.z = local_268.z;
  fVar18 = Dot<float>((Vector3<float> *)pTVar17,(Vector3<float> *)&local_1f8);
  fVar18 = fVar18 + -1.0;
  std::abs((int)pTVar17);
  if (0.001 < fVar18) {
LAB_0061aacc:
    Error<>((char *)in_stack_fffffffffffff790.memoryResource);
  }
  else {
    pTVar17 = &local_1b8;
    fVar18 = Dot<float>((Vector3<float> *)pTVar17,(Vector3<float> *)&local_238);
    fVar18 = fVar18 + -1.0;
    std::abs((int)pTVar17);
    if (0.001 < fVar18) goto LAB_0061aacc;
  }
  pTVar17 = &local_178;
  fVar18 = Dot<float>((Vector3<float> *)pTVar17,(Vector3<float> *)&local_1b8);
  std::abs((int)pTVar17);
  if (fVar18 <= 0.001) {
    pTVar17 = &local_1b8;
    fVar18 = Dot<float>((Vector3<float> *)pTVar17,(Vector3<float> *)&local_1f8);
    std::abs((int)pTVar17);
    if (fVar18 <= 0.001) {
      pTVar17 = &local_1f8;
      in_stack_fffffffffffff81c = Dot<float>((Vector3<float> *)pTVar17,(Vector3<float> *)&local_238)
      ;
      std::abs((int)pTVar17);
      if (in_stack_fffffffffffff81c <= 0.001) {
        pTVar17 = &local_238;
        in_stack_fffffffffffff814 =
             Dot<float>((Vector3<float> *)pTVar17,(Vector3<float> *)&local_178);
        in_stack_fffffffffffff818 = in_stack_fffffffffffff814;
        std::abs((int)pTVar17);
        if (in_stack_fffffffffffff814 <= 0.001) goto LAB_0061ac44;
      }
    }
  }
  Error<>((char *)in_stack_fffffffffffff790.memoryResource);
LAB_0061ac44:
  Frame::FromXY((Vector3f *)in_stack_fffffffffffff7a0,(Vector3f *)in_stack_fffffffffffff798);
  *(undefined4 *)(in_RDI + 0x1fc) = local_26c;
  *(undefined8 *)(in_RDI + 0x1dc) = local_28c;
  *(undefined8 *)(in_RDI + 0x1e4) = uStack_284;
  *(undefined8 *)(in_RDI + 0x1ec) = uStack_27c;
  *(undefined8 *)(in_RDI + 500) = uStack_274;
  dxdA = (Tuple2<pbrt::Point2,_int>)Image::Resolution(in_RDX);
  local_439._1_8_ = local_439 + 9;
  domain = (Bounds2f *)local_439;
  local_3b0 = dxdA;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798,
             (allocator<char> *)in_stack_fffffffffffff790.memoryResource);
  local_439._1_8_ = local_410;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798,
             (allocator<char> *)in_stack_fffffffffffff790.memoryResource);
  local_439._1_8_ = local_3f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798,
             (allocator<char> *)in_stack_fffffffffffff790.memoryResource);
  local_3d0 = local_439 + 9;
  local_3c8 = 3;
  v_00._M_array._4_4_ = in_stack_fffffffffffff76c;
  v_00._M_array._0_4_ = in_stack_fffffffffffff768;
  v_00._M_len = (size_type)in_stack_fffffffffffff770;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff760,v_00);
  Image::Encoding(in_stack_fffffffffffff758);
  channels.ptr._4_4_ = TVar22.z;
  channels.ptr._0_4_ = in_stack_fffffffffffff890;
  channels.n = TVar22._0_8_;
  Image::Image(pIVar15,in_stack_fffffffffffff87c,(Point2i)resolution,channels,encoding,AVar14);
  Image::operator=(in_stack_fffffffffffff760,local_8);
  Image::~Image(in_stack_fffffffffffff760);
  psVar23 = (string *)(local_439 + 9);
  this_00 = (string *)&local_3d0;
  pIVar15 = local_8;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar23);
  std::allocator<char>::~allocator(&local_43b);
  std::allocator<char>::~allocator(&local_43a);
  std::allocator<char>::~allocator((allocator<char> *)local_439);
  PVar16 = Image::Resolution((Image *)(in_RDI + 0xb8));
  iStack_454 = PVar16.super_Tuple2<pbrt::Point2,_int>.y;
  start = (long)iStack_454;
  std::function<void(long)>::
  function<pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight(pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*,float,std::__cxx11::string_const&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,pstd::pmr::polymorphic_allocator<std::byte>)::__0,void>
            ((function<void_(long)> *)in_stack_fffffffffffff770,
             (anon_class_24_3_18474c6b *)
             CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
  ParallelFor(start,(int64_t)in_stack_fffffffffffff7a8,
              (function<void_(long)> *)in_stack_fffffffffffff7a0);
  std::function<void_(long)>::~function((function<void_(long)> *)0x61af78);
  std::function<float(pbrt::Point2<float>)>::
  function<pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight(pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*,float,std::__cxx11::string_const&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,pstd::pmr::polymorphic_allocator<std::byte>)::__1&,void>
            ((function<float_(pbrt::Point2<float>)> *)in_stack_fffffffffffff770,
             (anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffff760,(float)((ulong)pIVar15 >> 0x20),
             SUB84(pIVar15,0));
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffff760,(float)((ulong)pIVar15 >> 0x20),
             SUB84(pIVar15,0));
  Bounds2<float>::Bounds2
            ((Bounds2<float> *)in_stack_fffffffffffff770,
             (Point2<float> *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
             (Point2<float> *)in_stack_fffffffffffff760);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff760);
  AVar14.memoryResource._4_4_ = in_stack_fffffffffffff81c;
  AVar14.memoryResource._0_4_ = in_stack_fffffffffffff818;
  Image::GetSamplingDistribution
            ((Image *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (function<float_(pbrt::Point2<float>)> *)dxdA,domain,AVar14);
  std::function<float_(pbrt::Point2<float>)>::~function
            ((function<float_(pbrt::Point2<float>)> *)0x61b03f);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff760);
  Array2D<float>::Array2D
            ((Array2D<float> *)in_stack_fffffffffffff788,
             (Array2D<float> *)in_stack_fffffffffffff780.memoryResource,
             (allocator_type)in_stack_fffffffffffff790.memoryResource);
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
            (in_stack_fffffffffffff788,(Array2D<float> *)in_stack_fffffffffffff780.memoryResource,
             in_stack_fffffffffffff790);
  WindowedPiecewiseConstant2D::operator=
            ((WindowedPiecewiseConstant2D *)in_stack_fffffffffffff760,
             (WindowedPiecewiseConstant2D *)pIVar15);
  WindowedPiecewiseConstant2D::~WindowedPiecewiseConstant2D
            ((WindowedPiecewiseConstant2D *)in_stack_fffffffffffff760);
  Array2D<float>::~Array2D((Array2D<float> *)in_stack_fffffffffffff770);
  Array2D<float>::~Array2D((Array2D<float> *)in_stack_fffffffffffff770);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x61b0ec);
  return;
}

Assistant:

PortalImageInfiniteLight::PortalImageInfiniteLight(
    const Transform &renderFromLight, Image equiAreaImage,
    const RGBColorSpace *imageColorSpace, Float scale, const std::string &filename,
    std::vector<Point3f> p, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(alloc),
      imageColorSpace(imageColorSpace),
      scale(scale),
      filename(filename),
      distribution(alloc) {
    // Initialize sampling PDFs for infinite area light
    ImageChannelDesc channelDesc = equiAreaImage.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for PortalImageInfiniteLight doesn't have R, "
                  "G, B channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());

    if (equiAreaImage.Resolution().x != equiAreaImage.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an "
                  "equirect environment map.",
                  filename, equiAreaImage.Resolution().x, equiAreaImage.Resolution().y);

    if (p.size() != 4)
        ErrorExit("Expected 4 vertices for infinite light portal but given %d", p.size());
    for (int i = 0; i < 4; ++i)
        portal[i] = p[i];

    // Compute frame for portal coordinate system
    Vector3f p01 = Normalize(portal[1] - portal[0]);
    Vector3f p12 = Normalize(portal[2] - portal[1]);
    Vector3f p32 = Normalize(portal[2] - portal[3]);
    Vector3f p03 = Normalize(portal[3] - portal[0]);
    // Do opposite edges have the same direction?
    if (std::abs(Dot(p01, p32) - 1) > .001 || std::abs(Dot(p12, p03) - 1) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    // Sides perpendicular?
    if (std::abs(Dot(p01, p12)) > .001 || std::abs(Dot(p12, p32)) > .001 ||
        std::abs(Dot(p32, p03)) > .001 || std::abs(Dot(p03, p01)) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    portalFrame = Frame::FromXY(p01, p03);

    // Resample environment map into rectified coordinates
    // Resample the latlong map into rectified coordinates
    image = Image(PixelFormat::Float, equiAreaImage.Resolution(), {"R", "G", "B"},
                  equiAreaImage.Encoding(), alloc);
    ParallelFor(0, image.Resolution().y, [&](int y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            // [0,1]^2 image coordinates
            Point2f st((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);

            Vector3f w = RenderFromImage(st);

            w = Normalize(renderFromLight.ApplyInverse(w));

            WrapMode2D equiAreaWrap(WrapMode::OctahedralSphere,
                                    WrapMode::OctahedralSphere);
            Point2f stEqui = EqualAreaSphereToSquare(w);
            for (int c = 0; c < 3; ++c)
                image.SetChannel({x, y}, c,
                                 equiAreaImage.BilerpChannel(stEqui, c, equiAreaWrap));
        }
    });

    // Initialize sampling PDFs for infinite area light
    auto duvdw = [&](const Point2f &p) {
        Float duv_dw;
        (void)RenderFromImage(p, &duv_dw);
        return duv_dw;
    };
    Array2D<Float> d = image.GetSamplingDistribution(duvdw);
    distribution = WindowedPiecewiseConstant2D(d, alloc);
}